

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O1

void __thiscall
CVmObjTable::add_to_gc_queue(CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry,uint state)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)&entry->field_0x14;
  if ((uVar1 & 0x20c) == 0x200) {
    entry->next_obj_ = this->gc_queue_head_;
    this->gc_queue_head_ = id;
    uVar1 = *(ushort *)&entry->field_0x14;
  }
  else if (state <= (uVar1 >> 2 & 3)) {
    return;
  }
  *(ushort *)&entry->field_0x14 = (uVar1 & 0xfff3) + ((ushort)state & 3) * 4;
  return;
}

Assistant:

void add_to_gc_queue(vm_obj_id_t id, CVmObjPageEntry *entry, uint state)
    {
        /* 
         *   If it's not already referenced somehow, add it to the queue.  If
         *   it's marked as referenced, it's already in the queue (or it's
         *   already been in the queue and it's been processed).
         *   
         *   If the object can't have references to other objects, don't add
         *   it to the queue - simply elevate its reachability state.  We put
         *   objects in the queue in order to trace into the objects they
         *   reference, so an object that can't reference any other objects
         *   doesn't need to go in the queue.  
         */
        if (entry->can_have_refs_ && entry->reachable_ == VMOBJ_UNREACHABLE)
        {
            /* add it to the work queue */
            entry->next_obj_ = gc_queue_head_;
            gc_queue_head_ = id;

            /* 
             *   Since the entry is unreachable, and unreachable is the
             *   lowest reachability state, we know that 'state' is at least
             *   as reachable, so we can just set the new state without even
             *   bothering with another comparison.
             */
            entry->reachable_ = state;
        }
        else
        {
            /* 
             *   Elevate the reachability state.  Never reduce an object's
             *   reachability state: Finalizer-Reachable is higher than
             *   Unreachable, and Reachable is higher than
             *   Finalizer-Reachable.
             *   
             *   In other words, if an object is already marked Reachable,
             *   never reduce its state to Finalizer-Reachable just because
             *   we find that it can also be reached from a
             *   Finalizer-Reachable object, when we already know that it
             *   can be reached from a root-set object.  
             */
            if (state > entry->reachable_)
                entry->reachable_ = state;
        }
    }